

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle *lightSampler,
                 CameraHandle *camera,SamplerHandle *sampler,optional<pbrt::Point2<float>_> *pRaster
                 ,Float *misWeightPtr)

{
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  this;
  BSDF *this_00;
  Vertex *pVVar1;
  long *plVar2;
  float fVar3;
  undefined4 uVar4;
  Interval IVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  undefined1 auVar12 [16];
  aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)> aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [8];
  Point3fi *pPVar16;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 aVar17;
  bool bVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  SurfaceInteraction *this_01;
  Normal3f *pNVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  Vertex *pVVar27;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  HaltonSampler *pHVar31;
  DebugMLTSampler *pDVar32;
  long in_FS_OFFSET;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Float FVar35;
  float fVar36;
  undefined1 auVar39 [16];
  undefined4 uVar37;
  undefined1 auVar40 [16];
  undefined8 uVar38;
  Tuple2<pbrt::Point2,_float> u;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar62 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar47 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar59 [64];
  undefined1 extraout_var_10 [56];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined8 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar74 [56];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar77 [16];
  Point3f PVar78;
  SampledSpectrum SVar79;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng;
  optional<pbrt::CameraWiSample> cs;
  optional<pbrt::LightLiSample> lightWeight;
  undefined1 local_498 [4];
  float afStack_494 [3];
  Vertex *local_488;
  SampledWavelengths *local_480;
  float local_478;
  DispatchSplit<9> local_471;
  Integrator *local_470;
  undefined1 local_468 [16];
  undefined8 local_458;
  undefined1 local_448 [16];
  undefined8 local_438;
  float local_430;
  float local_42c;
  Float local_428;
  Float FStack_424;
  Float FStack_420;
  Float FStack_41c;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_410;
  Vertex *local_408;
  Vertex *local_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 auStack_3e8 [16];
  Float local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined1 local_3c8 [16];
  undefined4 local_3ac;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  float fStack_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined4 uStack_368;
  MediumInterface *pMStack_364;
  undefined1 local_358 [8];
  long lStack_350;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  Interaction IStack_330;
  Interaction local_2e0;
  bool local_290;
  float local_288;
  float fStack_284;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  Interaction IStack_268;
  char local_218;
  undefined8 uStack_204;
  undefined8 uStack_1fc;
  undefined8 uStack_1f4;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1d0;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1c8;
  undefined8 local_1c0;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_1b8;
  Vertex local_1b0;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar48 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 auVar70 [64];
  
  uVar63 = 0;
  _local_498 = ZEXT816(0);
  if ((s != 0 && 1 < t) && (cameraVertices[(ulong)(uint)t - 1].type == Light)) {
    uVar38 = 0;
    goto LAB_003d77e7;
  }
  local_1b0.beta.values.values = (array<float,_4>)ZEXT816(0);
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.time = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_1b0.field_2._60_4_ = 0;
  local_1b0.field_2.ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
  local_1b0.field_2.ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (MediumHandle)
          (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0x0;
  local_1b0.field_2.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
  local_1b0.bsdf.bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits._0_4_ = 0;
  local_1b0.bsdf.bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits._4_4_ = 0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_1b0.delta = false;
  local_1b0.pdfFwd = 0.0;
  local_1b0.pdfRev = 0.0;
  auVar33 = in_ZMM2._0_16_;
  local_488 = cameraVertices;
  local_480 = lambda;
  local_470 = integrator;
  local_400 = lightVertices;
  if (s == 0) {
    if ((cameraVertices[(long)t + -1].type != Light) &&
       ((auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_),
        uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0),
        uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398),
        uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390),
        cameraVertices[(long)t + -1].type != Surface ||
        (auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_),
        uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0),
        uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398),
        uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390),
        (cameraVertices[(long)t + -1].field_2.si.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits & 0xffffffffffff) == 0)))) goto LAB_003d76be;
    auVar62 = ZEXT856(0);
    auVar74 = ZEXT856(0);
    SVar79 = Vertex::Le(cameraVertices + (long)t + -1,&integrator->infiniteLights,
                        cameraVertices + (long)t + -2,lambda);
    auVar66._0_8_ = SVar79.values.values._8_8_;
    auVar66._8_56_ = auVar74;
    auVar41._0_8_ = SVar79.values.values._0_8_;
    auVar41._8_56_ = auVar62;
    auVar33 = vmovlhps_avx(auVar41._0_16_,auVar66._0_16_);
    local_498 = (undefined1  [4])
                (auVar33._0_4_ * cameraVertices[(long)t + -1].beta.values.values[0]);
    afStack_494[0] = auVar33._4_4_ * cameraVertices[(long)t + -1].beta.values.values[1];
    afStack_494[1] = auVar33._8_4_ * cameraVertices[(long)t + -1].beta.values.values[2];
    afStack_494[2] = auVar33._12_4_ * cameraVertices[(long)t + -1].beta.values.values[3];
LAB_003d76b8:
    auVar15 = local_3a8;
    uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
    uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
  }
  else if (t == 1) {
    pVVar1 = lightVertices + (long)s + -1;
    bVar18 = Vertex::IsConnectible(pVVar1);
    pVVar27 = local_400;
    auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
    uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
    uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
    uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
    if (bVar18) {
      uVar25 = (sampler->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      local_3f8 = (undefined1  [8])&local_400[(long)s + -1].field_2;
      uVar11 = (ushort)(uVar25 >> 0x30);
      uVar20 = (uint)uVar11;
      if (uVar25 >> 0x30 < 5) {
        if (uVar20 < 3) {
          if (uVar20 == 2) {
            u = (Tuple2<pbrt::Point2,_float>)
                StratifiedSampler::Get2D((StratifiedSampler *)(uVar25 & 0xffffffffffff));
          }
          else {
            u = (Tuple2<pbrt::Point2,_float>)
                RandomSampler::Get2D((RandomSampler *)(uVar25 & 0xffffffffffff));
          }
        }
        else {
          pHVar31 = (HaltonSampler *)(uVar25 & 0xffffffffffff);
          if ((uVar20 & 6) == 2) {
            iVar21 = 2;
            if (pHVar31->dimension < 999) {
              iVar21 = pHVar31->dimension;
            }
            pHVar31->dimension = iVar21 + 2;
            local_448._0_4_ = HaltonSampler::SampleDimension(pHVar31,iVar21);
            local_448._4_4_ = extraout_XMM0_Db;
            local_448._8_4_ = extraout_XMM0_Dc;
            local_448._12_4_ = extraout_XMM0_Dd;
            auVar45._0_4_ = HaltonSampler::SampleDimension(pHVar31,iVar21 + 1);
            auVar45._4_60_ = extraout_var;
            auVar33 = auVar45._0_16_;
LAB_003d7333:
            auVar33 = vinsertps_avx(local_448,auVar33,0x10);
            u = auVar33._0_8_;
          }
          else {
            u = (Tuple2<pbrt::Point2,_float>)
                PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar31);
          }
        }
      }
      else {
        uVar23 = uVar11 - 4;
        if (uVar23 < 3) {
          if (uVar23 == 2) {
            u = (Tuple2<pbrt::Point2,_float>)
                ZSobolSampler::Get2D((ZSobolSampler *)(uVar25 & 0xffffffffffff));
          }
          else {
            u = (Tuple2<pbrt::Point2,_float>)
                SobolSampler::Get2D((SobolSampler *)(uVar25 & 0xffffffffffff));
          }
        }
        else if (uVar20 - 6 < 2) {
          u = (Tuple2<pbrt::Point2,_float>)
              PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar25 & 0xffffffffffff));
        }
        else {
          pDVar32 = (DebugMLTSampler *)(uVar25 & 0xffffffffffff);
          if (uVar20 - 6 != 2) {
            local_448._0_4_ = DebugMLTSampler::Get1D(pDVar32);
            local_448._4_4_ = extraout_XMM0_Db_00;
            local_448._8_4_ = extraout_XMM0_Dc_00;
            local_448._12_4_ = extraout_XMM0_Dd_00;
            auVar47._0_4_ = DebugMLTSampler::Get1D(pDVar32);
            auVar47._4_60_ = extraout_var_00;
            auVar33 = auVar47._0_16_;
            goto LAB_003d7333;
          }
          u = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar32);
        }
      }
      CameraHandle::SampleWi
                ((optional<pbrt::CameraWiSample> *)local_358,camera,(Interaction *)local_3f8,
                 (Point2f)u,local_480);
      auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
      uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
      uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
      uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
      if (local_290 == true) {
        if (pRaster->set == true) {
          pRaster->set = false;
        }
        aVar13._4_4_ = uStack_334;
        aVar13.__align = (anon_struct_4_0_00000001_for___align)uStack_338;
        pRaster->optionalValue = aVar13;
        pRaster->set = true;
        local_1b0.field_2.ei.field_0 =
             (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)
             (camera->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
        uStack_1d8 = 0;
        local_1b0.type = Camera;
        auVar7._4_4_ = uStack_33c;
        auVar7._0_4_ = uStack_33c;
        auVar7._8_4_ = uStack_33c;
        auVar7._12_4_ = uStack_33c;
        local_1b0.beta.values.values = (array<float,_4>)vdivps_avx512vl(_local_358,auVar7);
        pMStack_364 = local_2e0.mediumInterface;
        local_3a8._4_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             low;
        uStack_3a0._0_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        uStack_3a0._4_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             low;
        uStack_398._0_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uStack_398._4_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             low;
        uStack_390._0_4_ =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high;
        uStack_390._4_4_ = local_2e0.time;
        fStack_388 = local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_384 = local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        fStack_380 = local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        fStack_37c = local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.x;
        fStack_378 = local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.y;
        fStack_374 = local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.z;
        fStack_370 = local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.x;
        fStack_36c = local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.y;
        uStack_368 = local_2e0._60_4_;
        uStack_1e8 = 0;
        uStack_1e4 = 0;
        uStack_1e0 = 0;
        uStack_1dc = 0;
        local_1b0._20_4_ = local_3a8._0_4_;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             low;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        local_1b0.field_2._92_4_ = fStack_284;
        local_1b0.field_2._88_4_ = local_288;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             low;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             low;
        local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
             local_2e0.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high;
        local_1b0.field_2.ei.super_Interaction.time = local_2e0.time;
        local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
             local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
             local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
             local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
             local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.x;
        local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
             local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.y;
        local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
             local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
             local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.x;
        local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
             local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.y;
        local_1b0.field_2._60_4_ = local_2e0._60_4_;
        local_1b0.field_2.ei.super_Interaction.mediumInterface = local_2e0.mediumInterface;
        local_1b0.field_2.ei.super_Interaction.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (MediumHandle)
                (MediumHandle)
                local_2e0.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_1b0.field_2._220_8_ = uStack_204;
        local_1b0.field_2._228_8_ = uStack_1fc;
        local_1b0.field_2._236_8_ = uStack_1f4;
        local_1b0.bsdf.bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
        .bits._0_4_ = 0;
        local_1b0.bsdf.bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
        .bits._4_4_ = 0;
        local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
        local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
        local_1b0.field_2._96_8_ = uStack_280;
        local_1b0.field_2._104_8_ = uStack_278;
        local_1b0.field_2._112_8_ = uStack_270;
        local_1b0.field_2.mi.sigma_maj.values.values[0] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
             .low;
        local_1b0.field_2.mi.sigma_maj.values.values[1] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
             .high;
        local_1b0.field_2.mi.sigma_maj.values.values[2] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
             .low;
        local_1b0.field_2.mi.sigma_maj.values.values[3] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
             .high;
        local_1b0.field_2.mi.Le.values.values[0] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
             .low;
        local_1b0.field_2.mi.Le.values.values[1] =
             IStack_268.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
             .high;
        local_1b0.field_2.mi.Le.values.values[2] = IStack_268.time;
        local_1b0.field_2.mi.Le.values.values[3] =
             IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
             IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
             IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
             IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.x;
        local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
             IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.y;
        local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
             IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
             IStack_268.uv.super_Tuple2<pbrt::Point2,_float>.x;
        local_1b0.field_2._176_8_ = IStack_268._56_8_;
        local_1b0.field_2._184_8_ = IStack_268.mediumInterface;
        local_1b0.field_2.si.material.
        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        .bits = (MaterialHandle)
                (MaterialHandle)
                IStack_268.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
        local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
        local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
        local_1b0.delta = false;
        local_1b0.pdfFwd = 0.0;
        local_1b0.pdfRev = 0.0;
        auVar62 = ZEXT856(0);
        auVar74 = ZEXT856((ulong)IStack_268.n.super_Tuple3<pbrt::Normal3,_float>._0_8_);
        SVar79 = Vertex::f(pVVar1,&local_1b0,Importance);
        auVar70._0_8_ = SVar79.values.values._8_8_;
        auVar70._8_56_ = auVar74;
        auVar48._0_8_ = SVar79.values.values._0_8_;
        auVar48._8_56_ = auVar62;
        auVar33 = vmovlhps_avx(auVar48._0_16_,auVar70._0_16_);
        fVar36 = auVar33._0_4_ * pVVar27[(long)s + -1].beta.values.values[0] *
                 local_1b0.beta.values.values[0];
        afStack_494[0] =
             auVar33._4_4_ * pVVar27[(long)s + -1].beta.values.values[1] *
             local_1b0.beta.values.values[1];
        afStack_494[1] =
             auVar33._8_4_ * pVVar27[(long)s + -1].beta.values.values[2] *
             local_1b0.beta.values.values[2];
        afStack_494[2] =
             auVar33._12_4_ * pVVar27[(long)s + -1].beta.values.values[3] *
             local_1b0.beta.values.values[3];
        local_498 = (undefined1  [4])fVar36;
        if ((((pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar3 = pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.y, fVar3 != 0.0)) || (NAN(fVar3))) ||
           ((fVar3 = pVVar27[(long)s + -1].field_2.ei.super_Interaction.n.
                     super_Tuple3<pbrt::Normal3,_float>.z, fVar3 != 0.0 || (NAN(fVar3))))) {
          if (local_290 == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
          }
          pNVar22 = &(pVVar1->field_2).ei.super_Interaction.n;
          if (pVVar1->type == Surface) {
            pNVar22 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
          }
          fVar3 = (pNVar22->super_Tuple3<pbrt::Normal3,_float>).z;
          auVar77 = ZEXT416((uint)(fVar3 * (float)uStack_340));
          auVar33 = vfmadd132ss_fma(ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).y),
                                    auVar77,ZEXT416((uint)uStack_344));
          auVar77 = vfmsub213ss_fma(ZEXT416((uint)uStack_340),ZEXT416((uint)fVar3),auVar77);
          auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar33._0_4_ + auVar77._0_4_)),
                                    ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).x),
                                    ZEXT416((uint)uStack_348));
          uVar37 = auVar33._0_4_;
          auVar39._4_4_ = uVar37;
          auVar39._0_4_ = uVar37;
          auVar39._8_4_ = uVar37;
          auVar39._12_4_ = uVar37;
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx512vl(auVar39,auVar8);
          fVar36 = auVar33._0_4_ * fVar36;
          afStack_494[0] = auVar33._4_4_ * afStack_494[0];
          local_498 = (undefined1  [4])fVar36;
          afStack_494[1] = auVar33._8_4_ * afStack_494[1];
          afStack_494[2] = auVar33._12_4_ * afStack_494[2];
        }
        if ((fVar36 == 0.0) && (!NAN(fVar36))) {
          uVar25 = 0xffffffffffffffff;
          do {
            auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
            uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
            uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
            uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
            if (uVar25 == 2) goto LAB_003d76be;
            lVar29 = uVar25 * 4;
            uVar25 = uVar25 + 1;
          } while ((*(float *)(local_498 + lVar29 + 8) == 0.0) &&
                  (!NAN(*(float *)(local_498 + lVar29 + 8))));
          auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
          uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
          uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
          uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
          if (2 < uVar25) goto LAB_003d76be;
        }
        if (local_290 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
        }
        lVar29 = 0;
        uVar25 = CONCAT44(uStack_334,uStack_338) * -0x395b586ca42e166b;
        IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_ = local_2e0.mediumInterface;
        IStack_268.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ =
             local_2e0.medium.
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             .bits;
        uVar28 = 0x13745e0cb198fe90;
        uVar25 = ((uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
                 -0x395b586ca42e166b;
        uVar25 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
        do {
          plVar2 = (long *)((long)&local_288 + lVar29);
          lVar29 = lVar29 + 8;
          uVar30 = *plVar2 * -0x395b586ca42e166b;
          uVar28 = (uVar28 ^ (uVar30 >> 0x2f ^ uVar30) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
        } while (lVar29 != 0x50);
        uVar25 = uVar25 >> 0x2f ^ uVar25;
        uStack_3a0 = (undefined8 *)(uVar25 * 2 + 1);
        uVar28 = (uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b;
        local_3a8 = (undefined1  [8])
                    (((uVar28 >> 0x2f ^ uVar28) + 1) * 0x5851f42d4c957f2d +
                     uVar25 * -0x4f5c17a566d501a4 + 1);
        auVar62 = ZEXT856(CONCAT44(local_2e0.pi.super_Point3<pbrt::Interval>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                                   local_2e0.pi.super_Point3<pbrt::Interval>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low));
        auVar74 = ZEXT856(0);
        SVar79 = Integrator::Tr(local_470,&IStack_330,&local_2e0,local_480,(RNG *)local_3a8);
        auVar71._0_8_ = SVar79.values.values._8_8_;
        auVar71._8_56_ = auVar74;
        auVar77 = auVar71._0_16_;
        auVar49._0_8_ = SVar79.values.values._0_8_;
        auVar49._8_56_ = auVar62;
        auVar33 = auVar49._0_16_;
LAB_003d76ae:
        auVar33 = vmovlhps_avx(auVar33,auVar77);
        local_498 = (undefined1  [4])(auVar33._0_4_ * (float)local_498);
        afStack_494[0] = auVar33._4_4_ * afStack_494[0];
        afStack_494[1] = auVar33._8_4_ * afStack_494[1];
        afStack_494[2] = auVar33._12_4_ * afStack_494[2];
        goto LAB_003d76b8;
      }
    }
  }
  else if (s == 1) {
    bVar18 = Vertex::IsConnectible(cameraVertices + (long)t + -1);
    auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
    uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
    uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
    uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
    if (bVar18) {
      uVar25 = (sampler->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      local_358 = (undefined1  [8])uVar25;
      local_408 = cameraVertices + (long)t + -1;
      FVar35 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_288,local_358,uVar25 >> 0x30)
      ;
      uVar25 = (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
      if (((ushort)(uVar25 >> 0x30) < 3) && ((uVar25 & 0x3000000000000) == 0x2000000000000)) {
        PowerLightSampler::Sample
                  ((optional<pbrt::SampledLight> *)local_468,
                   (PowerLightSampler *)(uVar25 & 0xffffffffffff),FVar35);
        bVar19 = local_458._0_1_;
      }
      else {
        lVar29 = *(long *)((uVar25 & 0xffffffffffff) + 0x18);
        if (lVar29 == 0) {
          local_468._0_12_ = ZEXT412(0);
          local_468._12_4_ = 0;
          local_458._0_1_ = false;
          local_458._1_7_ = 0;
          bVar19 = false;
        }
        else {
          auVar33 = vcvtusi2ss_avx512f(auVar33,lVar29);
          iVar21 = (int)lVar29 + -1;
          iVar24 = (int)(FVar35 * auVar33._0_4_);
          if (iVar24 <= iVar21) {
            iVar21 = iVar24;
          }
          bVar19 = true;
          local_468._8_4_ = 1.0 / auVar33._0_4_;
          local_468._0_8_ =
               *(undefined8 *)(*(long *)((uVar25 & 0xffffffffffff) + 8) + (long)iVar21 * 8);
        }
        local_458._0_1_ = (bool)bVar19;
      }
      pVVar1 = local_488;
      auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
      uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
      uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
      uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
      if ((bVar19 & 1) != 0) {
        local_410 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)local_468._0_8_;
        local_42c = (float)local_468._8_4_;
        if ((((local_488[(long)t + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar36 = local_488[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar36 != 0.0)) || (NAN(fVar36))) ||
           ((fVar36 = local_488[(long)t + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.z, fVar36 != 0.0 || (NAN(fVar36))))) {
          this_01 = Interaction::AsSurface(&local_488[(long)t + -1].field_2.ei.super_Interaction);
          pPVar16 = &(this_01->super_Interaction).pi;
          local_430 = (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          IVar5 = (this_01->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          this_00 = &pVVar1[(long)t + -1].bsdf;
          local_448._8_8_ = 0;
          local_448._0_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          local_448._4_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          uVar4 = (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar6 = (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_3c8._4_4_ = uVar6;
          local_3c8._0_4_ = uVar4;
          local_478 = (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          _local_3f8 = ZEXT832((ulong)(this_01->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
          local_428 = IVar5.low;
          FStack_424 = IVar5.high;
          FStack_420 = 0.0;
          FStack_41c = 0.0;
          local_438._0_4_ = (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_438._4_4_ = (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_3c8._8_8_ = 0;
          auVar62 = ZEXT856(0);
          bVar18 = BSDF::HasReflection(this_00);
          if ((!bVar18) || (bVar18 = BSDF::HasTransmission(this_00), bVar18)) {
            bVar18 = BSDF::HasTransmission(this_00);
            if ((!bVar18) || (bVar18 = BSDF::HasReflection(this_00), bVar18)) goto LAB_003d78f7;
            uVar25._0_4_ = (this_01->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar25._4_4_ = (this_01->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar33._0_8_ = uVar25 ^ 0x8000000080000000;
            auVar33._8_4_ = 0x80000000;
            auVar33._12_4_ = 0x80000000;
            auVar62 = ZEXT856(auVar33._8_8_);
            uVar63 = vmovlps_avx(auVar33);
            lStack_350._0_4_ = -(this_01->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z
            ;
            local_358 = (undefined1  [8])uVar63;
            PVar78 = Interaction::OffsetRayOrigin(&this_01->super_Interaction,(Vector3f *)local_358)
            ;
            local_428 = PVar78.super_Tuple3<pbrt::Point3,_float>.z;
            auVar46._0_8_ = PVar78.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar46._8_56_ = auVar62;
            auVar33 = auVar46._0_16_;
          }
          else {
            PVar78 = Interaction::OffsetRayOrigin
                               (&this_01->super_Interaction,&(this_01->super_Interaction).wo);
            local_428 = PVar78.super_Tuple3<pbrt::Point3,_float>.z;
            auVar50._0_8_ = PVar78.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar50._8_56_ = auVar62;
            auVar33 = auVar50._0_16_;
          }
          uVar37 = auVar33._0_4_;
          local_448 = vmovshdup_avx(auVar33);
          _local_3f8 = ZEXT1632(CONCAT412(uVar37,CONCAT48(uVar37,CONCAT44(uVar37,uVar37))));
          FStack_424 = local_428;
          FStack_420 = local_428;
          FStack_41c = local_428;
        }
        else {
          local_478 = 0.0;
          _local_3f8 = ZEXT832((ulong)local_488[(long)t + -1].field_2.ei.super_Interaction.pi.
                                      super_Point3<pbrt::Interval>.
                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
          pPVar16 = &local_488[(long)t + -1].field_2.ei.super_Interaction.pi;
          local_448._8_8_ = 0;
          local_448._0_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          local_448._4_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          IVar5 = local_488[(long)t + -1].field_2.ei.super_Interaction.pi.
                  super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          local_430 = 0.0;
          local_438 = 0;
          local_428 = IVar5.low;
          FStack_424 = IVar5.high;
          FStack_420 = 0.0;
          FStack_41c = 0.0;
          local_3c8 = ZEXT816(0) << 0x20;
        }
LAB_003d78f7:
        aVar17 = local_410;
        uVar25 = (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        uVar11 = (ushort)(uVar25 >> 0x30);
        uVar20 = (uint)uVar11;
        if (uVar25 >> 0x30 < 5) {
          if (uVar25 < 0x3000000000000) {
            if (uVar20 == 2) {
              auVar51._0_8_ =
                   StratifiedSampler::Get2D((StratifiedSampler *)(uVar25 & 0xffffffffffff));
              auVar51._8_56_ = extraout_var_03;
              auVar33 = auVar51._0_16_;
            }
            else {
              auVar55._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar25 & 0xffffffffffff));
              auVar55._8_56_ = extraout_var_06;
              auVar33 = auVar55._0_16_;
            }
          }
          else {
            pHVar31 = (HaltonSampler *)(uVar25 & 0xffffffffffff);
            if ((uVar20 & 6) == 2) {
              iVar21 = 2;
              if (pHVar31->dimension < 999) {
                iVar21 = pHVar31->dimension;
              }
              pHVar31->dimension = iVar21 + 2;
              local_3d8 = HaltonSampler::SampleDimension(pHVar31,iVar21);
              uStack_3d4 = extraout_XMM0_Db_01;
              uStack_3d0 = extraout_XMM0_Dc_01;
              uStack_3cc = extraout_XMM0_Dd_01;
              auVar53._0_4_ = HaltonSampler::SampleDimension(pHVar31,iVar21 + 1);
              auVar53._4_60_ = extraout_var_01;
              auVar33 = auVar53._0_16_;
LAB_003d7a56:
              auVar77._4_4_ = uStack_3d4;
              auVar77._0_4_ = local_3d8;
              auVar77._8_4_ = uStack_3d0;
              auVar77._12_4_ = uStack_3cc;
              auVar33 = vinsertps_avx(auVar77,auVar33,0x10);
            }
            else {
              auVar57._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar31);
              auVar57._8_56_ = extraout_var_08;
              auVar33 = auVar57._0_16_;
            }
          }
        }
        else {
          uVar23 = uVar11 - 4;
          if (uVar23 < 3) {
            if (uVar23 == 2) {
              auVar52._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar25 & 0xffffffffffff));
              auVar52._8_56_ = extraout_var_04;
              auVar33 = auVar52._0_16_;
            }
            else {
              auVar56._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar25 & 0xffffffffffff));
              auVar56._8_56_ = extraout_var_07;
              auVar33 = auVar56._0_16_;
            }
          }
          else if (uVar20 - 6 < 2) {
            auVar54._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar25 & 0xffffffffffff));
            auVar54._8_56_ = extraout_var_05;
            auVar33 = auVar54._0_16_;
          }
          else {
            pDVar32 = (DebugMLTSampler *)(uVar25 & 0xffffffffffff);
            if (uVar20 - 6 != 2) {
              local_3d8 = DebugMLTSampler::Get1D(pDVar32);
              uStack_3d4 = extraout_XMM0_Db_02;
              uStack_3d0 = extraout_XMM0_Dc_02;
              uStack_3cc = extraout_XMM0_Dd_02;
              auVar59._0_4_ = DebugMLTSampler::Get1D(pDVar32);
              auVar59._4_60_ = extraout_var_02;
              auVar33 = auVar59._0_16_;
              goto LAB_003d7a56;
            }
            auVar58._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar32);
            auVar58._8_56_ = extraout_var_09;
            auVar33 = auVar58._0_16_;
          }
        }
        auVar75._16_16_ = local_448;
        auVar75._0_16_ = auVar33;
        uStack_390 = &local_3ac;
        local_3a8 = (undefined1  [8])local_358;
        local_58 = *(undefined8 *)(local_480->lambda).values;
        uStack_50 = *(undefined8 *)((local_480->lambda).values + 2);
        uStack_48 = *(undefined8 *)(local_480->pdf).values;
        uStack_40 = *(undefined8 *)((local_480->pdf).values + 2);
        uStack_398 = &local_58;
        local_3ac = 1;
        auVar65._16_16_ = local_3c8;
        auVar65._0_16_ = auVar33;
        auVar65 = vperm2f128_avx(auVar75,auVar65,0x31);
        auVar76._0_16_ = local_3f8._0_16_;
        auVar76._20_4_ = FStack_424;
        auVar76._16_4_ = local_428;
        auVar76._24_4_ = FStack_420;
        auVar76._28_4_ = FStack_41c;
        _local_358 = vunpcklpd_avx(auVar76,auVar65);
        uStack_338 = local_478;
        uStack_334 = (undefined4)local_438;
        IStack_330.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
             = (Float)((ulong)local_438 >> 0x20);
        IStack_330.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
             = local_430;
        uStack_3a0 = &local_1c0;
        local_1c0 = vmovlps_avx(auVar33);
        local_1b8 = aVar17;
        DispatchSplit<9>::operator()(&local_288,&local_471,&local_1b8,(ulong)aVar17 >> 0x30);
        pVVar27 = local_408;
        auVar15 = local_3a8;
        if (local_218 == '\x01') {
          if ((local_288 == 0.0) && (!NAN(local_288))) {
            uVar25 = 0xffffffffffffffff;
            do {
              if (uVar25 == 2) goto LAB_003d76be;
              fVar36 = *(float *)((long)&uStack_280 + uVar25 * 4);
              uVar25 = uVar25 + 1;
            } while ((fVar36 == 0.0) && (!NAN(fVar36)));
            if (2 < uVar25) goto LAB_003d76be;
          }
          if (0.0 < uStack_270._4_4_) {
            fVar36 = uStack_270._4_4_ * local_42c;
            auVar14._4_4_ = fStack_284;
            auVar14._0_4_ = local_288;
            auVar14._8_8_ = uStack_280;
            local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            local_1b0.type = Light;
            pMStack_364 = IStack_268.mediumInterface;
            auVar64._4_4_ = fVar36;
            auVar64._0_4_ = fVar36;
            auVar64._8_4_ = fVar36;
            auVar64._12_4_ = fVar36;
            local_1b0.beta.values.values = (array<float,_4>)vdivps_avx(auVar14,auVar64);
            local_3a8._4_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
            uStack_3a0._0_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            uStack_3a0._4_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            uStack_398._0_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            uStack_398._4_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            uStack_390._0_4_ =
                 IStack_268.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            uStack_390._4_4_ = IStack_268.time;
            fStack_388 = IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            fStack_384 = IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            fStack_380 = IStack_268.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            fStack_37c = IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.x;
            fStack_378 = IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_374 = IStack_268.n.super_Tuple3<pbrt::Normal3,_float>.z;
            fStack_370 = IStack_268.uv.super_Tuple2<pbrt::Point2,_float>.x;
            fStack_36c = IStack_268.uv.super_Tuple2<pbrt::Point2,_float>.y;
            uStack_368 = IStack_268._60_4_;
            local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_2e0.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_2e0.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            local_1b0.field_2._120_8_ = CONCAT44(uStack_334,uStack_338);
            local_1b0.field_2._128_8_ =
                 CONCAT44(IStack_330.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                          IStack_330.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
            local_1b0._20_4_ = local_3a8._0_4_;
            local_1b0.field_2._0_4_ = local_3a8._4_4_;
            local_1b0.field_2._4_4_ = (Float)uStack_3a0;
            local_1b0.field_2._220_8_ =
                 CONCAT44(local_2e0.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low,
                          local_2e0.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high);
            local_1b0.field_2._228_8_ =
                 CONCAT44(local_2e0.time,
                          local_2e0.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high);
            local_1b0.field_2._236_8_ =
                 CONCAT44(local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.y,
                          local_2e0.wo.super_Tuple3<pbrt::Vector3,_float>.x);
            local_1b0.field_2.ei.super_Interaction.mediumInterface = IStack_268.mediumInterface;
            local_1b0.field_2.ei.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (MediumHandle)
                    (MediumHandle)
                    IStack_268.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
            local_1b0.field_2.ei.field_0 = aVar17;
            local_1b0.field_2._88_8_ = local_358;
            local_1b0.field_2._96_8_ = lStack_350;
            local_1b0.field_2._104_8_ = _uStack_348;
            local_1b0.field_2._112_8_ = _uStack_340;
            local_1b0.field_2.mi.Le.values.values[0] =
                 IStack_330.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            local_1b0.field_2.mi.Le.values.values[1] =
                 IStack_330.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            local_1b0.field_2.mi.Le.values.values[2] =
                 IStack_330.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            local_1b0.field_2.mi.Le.values.values[3] =
                 IStack_330.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            local_1b0.bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._0_4_ = 0;
            local_1b0.bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._4_4_ = 0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = IStack_330.time
            ;
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
                 IStack_330.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
                 IStack_330.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
                 IStack_330.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
                 IStack_330.n.super_Tuple3<pbrt::Normal3,_float>.x;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
                 IStack_330.n.super_Tuple3<pbrt::Normal3,_float>.y;
            local_1b0.field_2.si.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
                 IStack_330.n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_1b0.field_2.si.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
                 IStack_330.uv.super_Tuple2<pbrt::Point2,_float>.x;
            local_1b0.field_2._184_8_ = IStack_330._56_8_;
            local_1b0.field_2.si.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits = (MaterialHandle)(MaterialHandle)IStack_330.mediumInterface;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
            local_1b0.delta = false;
            local_1b0.pdfFwd = 0.0;
            local_1b0.pdfRev = 0.0;
            local_1c8.bits =
                 (lightSampler->
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 ).bits;
            auVar74 = ZEXT856((ulong)IStack_330.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_);
            local_1b0.field_2._8_4_ = uStack_3a0._4_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)uStack_398;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = uStack_398._4_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = (Float)uStack_390;
            local_1b0.field_2.ei.super_Interaction.time = uStack_390._4_4_;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
                 fStack_388;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                 fStack_384;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
                 fStack_380;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
                 fStack_37c;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
                 fStack_378;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                 fStack_374;
            local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                 fStack_370;
            local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                 fStack_36c;
            local_1b0.field_2._60_4_ = uStack_368;
            FVar35 = Vertex::PDFLightOrigin
                               (&local_1b0,&local_470->infiniteLights,local_408,
                                (LightSamplerHandle *)&local_1c8);
            local_1b0.pdfFwd = FVar35;
            auVar62 = extraout_var_10;
            SVar79 = Vertex::f(pVVar27,&local_1b0,Radiance);
            auVar72._0_8_ = SVar79.values.values._8_8_;
            auVar72._8_56_ = auVar74;
            auVar60._0_8_ = SVar79.values.values._0_8_;
            auVar60._8_56_ = auVar62;
            auVar33 = vmovlhps_avx(auVar60._0_16_,auVar72._0_16_);
            fVar36 = auVar33._0_4_ * pVVar1[(long)t + -1].beta.values.values[0] *
                     local_1b0.beta.values.values[0];
            afStack_494[0] =
                 auVar33._4_4_ * pVVar1[(long)t + -1].beta.values.values[1] *
                 local_1b0.beta.values.values[1];
            afStack_494[1] =
                 auVar33._8_4_ * pVVar1[(long)t + -1].beta.values.values[2] *
                 local_1b0.beta.values.values[2];
            afStack_494[2] =
                 auVar33._12_4_ * pVVar1[(long)t + -1].beta.values.values[3] *
                 local_1b0.beta.values.values[3];
            local_498 = (undefined1  [4])fVar36;
            if ((((pVVar1[(long)t + -1].field_2.ei.super_Interaction.n.
                   super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
                 (fVar3 = pVVar1[(long)t + -1].field_2.ei.super_Interaction.n.
                          super_Tuple3<pbrt::Normal3,_float>.y, fVar3 != 0.0)) || (NAN(fVar3))) ||
               ((fVar3 = pVVar1[(long)t + -1].field_2.ei.super_Interaction.n.
                         super_Tuple3<pbrt::Normal3,_float>.z, fVar3 != 0.0 || (NAN(fVar3))))) {
              if (local_218 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
              }
              pNVar22 = &(local_408->field_2).ei.super_Interaction.n;
              if (local_408->type == Surface) {
                pNVar22 = (Normal3f *)((local_408->field_2).mi.sigma_maj.values.values + 2);
              }
              fVar3 = (pNVar22->super_Tuple3<pbrt::Normal3,_float>).z;
              auVar77 = ZEXT416((uint)(fVar3 * (float)uStack_270));
              auVar33 = vfmadd132ss_fma(ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).
                                                      y),auVar77,ZEXT416(uStack_278._4_4_));
              auVar77 = vfmsub213ss_fma(ZEXT416((uint)(float)uStack_270),ZEXT416((uint)fVar3),
                                        auVar77);
              auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar33._0_4_ + auVar77._0_4_)),
                                        ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).
                                                      x),ZEXT416((uint)uStack_278));
              uVar37 = auVar33._0_4_;
              auVar40._4_4_ = uVar37;
              auVar40._0_4_ = uVar37;
              auVar40._8_4_ = uVar37;
              auVar40._12_4_ = uVar37;
              auVar9._8_4_ = 0x7fffffff;
              auVar9._0_8_ = 0x7fffffff7fffffff;
              auVar9._12_4_ = 0x7fffffff;
              auVar33 = vandps_avx512vl(auVar40,auVar9);
              fVar36 = auVar33._0_4_ * fVar36;
              afStack_494[0] = auVar33._4_4_ * afStack_494[0];
              local_498 = (undefined1  [4])fVar36;
              afStack_494[1] = auVar33._8_4_ * afStack_494[1];
              afStack_494[2] = auVar33._12_4_ * afStack_494[2];
            }
            if ((fVar36 == 0.0) && (!NAN(fVar36))) {
              uVar25 = 0xffffffffffffffff;
              do {
                auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
                uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
                uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
                uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
                if (uVar25 == 2) goto LAB_003d76be;
                lVar29 = uVar25 * 4;
                uVar25 = uVar25 + 1;
              } while ((*(float *)(local_498 + lVar29 + 8) == 0.0) &&
                      (!NAN(*(float *)(local_498 + lVar29 + 8))));
              auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
              uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
              uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
              uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
              if (2 < uVar25) goto LAB_003d76be;
            }
            auVar12._4_4_ = FStack_424;
            auVar12._0_4_ = local_428;
            auVar12._8_4_ = FStack_420;
            auVar12._12_4_ = FStack_41c;
            auVar33 = vhaddps_avx(local_3f8._0_16_,local_448);
            auVar77 = vhaddps_avx(auVar12,auVar12);
            auVar33 = vshufps_avx(auVar33,auVar33,0xe8);
            auVar10._8_4_ = 0x3f000000;
            auVar10._0_8_ = 0x3f0000003f000000;
            auVar10._12_4_ = 0x3f000000;
            auVar33 = vmulps_avx512vl(auVar33,auVar10);
            uVar25 = auVar33._0_8_ * -0x395b586ca42e166b;
            uVar25 = (CONCAT44((int)(uVar25 >> 0x20),auVar77._0_4_ * 0.5) ^
                     ((uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                     -0x395b586ca42e166b) * -0x395b586ca42e166b;
            uVar25 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
            uVar28 = ((ulong)(uint)local_478 ^
                     (((ulong)(local_3c8._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
                      local_3c8._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^
                     0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
            uVar25 = uVar25 >> 0x2f ^ uVar25;
            uVar28 = (uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b;
            lStack_350 = uVar25 * 2 + 1;
            local_358 = (undefined1  [8])
                        (((uVar28 >> 0x2f ^ uVar28) + 1) * 0x5851f42d4c957f2d +
                         uVar25 * -0x4f5c17a566d501a4 + 1);
            if (local_218 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
            }
            auVar62 = ZEXT856((ulong)local_3c8._8_8_);
            auVar74 = (undefined1  [56])0x0;
            SVar79 = Integrator::Tr(local_470,&pVVar1[(long)t + -1].field_2.ei.super_Interaction,
                                    &IStack_268,local_480,(RNG *)local_358);
            auVar73._0_8_ = SVar79.values.values._8_8_;
            auVar73._8_56_ = auVar74;
            auVar77 = auVar73._0_16_;
            auVar61._0_8_ = SVar79.values.values._0_8_;
            auVar61._8_56_ = auVar62;
            auVar33 = auVar61._0_16_;
            goto LAB_003d76ae;
          }
        }
      }
    }
  }
  else {
    this.bits = (uintptr_t)(lightVertices + (long)s + -1);
    auVar62 = ZEXT856(0);
    auVar74 = ZEXT856(0);
    bVar18 = Vertex::IsConnectible((Vertex *)this.bits);
    pVVar1 = local_488;
    auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
    uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
    uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
    uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
    if (bVar18) {
      pVVar27 = local_488 + (long)t + -1;
      bVar18 = Vertex::IsConnectible(pVVar27);
      auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
      uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
      uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
      uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
      if (bVar18) {
        SVar79 = Vertex::f((Vertex *)this.bits,pVVar27,Importance);
        auVar67._0_8_ = SVar79.values.values._8_8_;
        auVar67._8_56_ = auVar74;
        auVar42._0_8_ = SVar79.values.values._0_8_;
        auVar42._8_56_ = auVar62;
        auVar33 = vmovlhps_avx(auVar42._0_16_,auVar67._0_16_);
        local_3f8._0_4_ = auVar33._0_4_ * lightVertices[(long)s + -1].beta.values.values[0];
        local_3f8._4_4_ = auVar33._4_4_ * lightVertices[(long)s + -1].beta.values.values[1];
        fStack_3f0 = auVar33._8_4_ * lightVertices[(long)s + -1].beta.values.values[2];
        fStack_3ec = auVar33._12_4_ * lightVertices[(long)s + -1].beta.values.values[3];
        auVar62 = ZEXT856(local_3f8._8_8_);
        sampler_00.bits = this.bits;
        SVar79 = Vertex::f(pVVar27,(Vertex *)this.bits,Radiance);
        auVar68._0_8_ = SVar79.values.values._8_8_;
        auVar68._8_56_ = auVar74;
        auVar43._0_8_ = SVar79.values.values._0_8_;
        auVar43._8_56_ = auVar62;
        auVar33 = vmovlhps_avx(auVar43._0_16_,auVar68._0_16_);
        local_498 = (undefined1  [4])
                    (auVar33._0_4_ * (float)local_3f8._0_4_ *
                    pVVar1[(long)t + -1].beta.values.values[0]);
        afStack_494[0] =
             auVar33._4_4_ * (float)local_3f8._4_4_ * pVVar1[(long)t + -1].beta.values.values[1];
        afStack_494[1] = auVar33._8_4_ * fStack_3f0 * pVVar1[(long)t + -1].beta.values.values[2];
        afStack_494[2] = auVar33._12_4_ * fStack_3ec * pVVar1[(long)t + -1].beta.values.values[3];
        auVar74 = ZEXT856(local_498._8_8_);
        auVar62 = ZEXT856(0);
        if (((float)local_498 == 0.0) && (!NAN((float)local_498))) {
          uVar25 = 0xffffffffffffffff;
          do {
            auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
            uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
            uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
            uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
            if (uVar25 == 2) goto LAB_003d76be;
            lVar29 = uVar25 * 4;
            auVar74 = (undefined1  [56])0x0;
            uVar25 = uVar25 + 1;
          } while ((*(float *)(local_498 + lVar29 + 8) == 0.0) &&
                  (!NAN(*(float *)(local_498 + lVar29 + 8))));
          auVar15 = (undefined1  [8])CONCAT44(local_3a8._4_4_,local_3a8._0_4_);
          uStack_3a0 = (undefined8 *)CONCAT44(uStack_3a0._4_4_,(Float)uStack_3a0);
          uStack_398 = (undefined8 *)CONCAT44(uStack_398._4_4_,(Float)uStack_398);
          uStack_390 = (undefined4 *)CONCAT44(uStack_390._4_4_,(Float)uStack_390);
          if (2 < uVar25) goto LAB_003d76be;
        }
        SVar79 = G(local_470,(SamplerHandle)sampler_00.bits,(Vertex *)this.bits,pVVar27,local_480);
        auVar69._0_8_ = SVar79.values.values._8_8_;
        auVar69._8_56_ = auVar74;
        auVar77 = auVar69._0_16_;
        auVar44._0_8_ = SVar79.values.values._0_8_;
        auVar44._8_56_ = auVar62;
        auVar33 = auVar44._0_16_;
        goto LAB_003d76ae;
      }
    }
  }
LAB_003d76be:
  *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
  if (((float)local_498 == 0.0) && (!NAN((float)local_498))) {
    uVar25 = 0xffffffffffffffff;
    do {
      if (uVar25 == 2) goto LAB_003d770a;
      lVar29 = uVar25 * 4;
      uVar25 = uVar25 + 1;
    } while ((*(float *)(local_498 + lVar29 + 8) == 0.0) &&
            (!NAN(*(float *)(local_498 + lVar29 + 8))));
    if (2 < uVar25) {
LAB_003d770a:
      *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
    }
  }
  *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
  lVar29 = (long)(s + -2 + t);
  *(long *)(in_FS_OFFSET + -0x268) = *(long *)(in_FS_OFFSET + -0x268) + lVar29;
  lVar26 = *(long *)(in_FS_OFFSET + -0x640);
  if (lVar29 <= *(long *)(in_FS_OFFSET + -0x640)) {
    lVar26 = lVar29;
  }
  if (lVar29 < *(long *)(in_FS_OFFSET + -0x638)) {
    lVar29 = *(long *)(in_FS_OFFSET + -0x638);
  }
  *(long *)(in_FS_OFFSET + -0x640) = lVar26;
  *(long *)(in_FS_OFFSET + -0x638) = lVar29;
  if (((float)local_498 != 0.0) || (NAN((float)local_498))) {
LAB_003d7772:
    local_1d0.bits =
         (lightSampler->
         super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
         ).bits;
    local_3a8 = auVar15;
    fVar36 = MISWeight(local_470,local_400,local_488,&local_1b0,s,t,(LightSamplerHandle *)&local_1d0
                      );
  }
  else {
    uVar25 = 0xffffffffffffffff;
    fVar36 = 0.0;
    do {
      if (uVar25 == 2) goto LAB_003d77a7;
      lVar29 = uVar25 * 4;
      uVar25 = uVar25 + 1;
    } while ((*(float *)(local_498 + lVar29 + 8) == 0.0) &&
            (!NAN(*(float *)(local_498 + lVar29 + 8))));
    if (uVar25 < 3) goto LAB_003d7772;
  }
LAB_003d77a7:
  afStack_494[0] = fVar36 * afStack_494[0];
  local_498 = (undefined1  [4])(fVar36 * (float)local_498);
  afStack_494[1] = fVar36 * afStack_494[1];
  afStack_494[2] = fVar36 * afStack_494[2];
  if (misWeightPtr != (Float *)0x0) {
    *misWeightPtr = fVar36;
  }
  auVar33 = *(undefined1 (*) [16])(local_480->pdf).values;
  uVar25 = vcmpps_avx512vl(auVar33,ZEXT816(0) << 0x40,4);
  auVar33 = vdivps_avx512vl(_local_498,auVar33);
  uVar38 = CONCAT44((uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_,
                    (uint)((byte)uVar25 & 1) * auVar33._0_4_);
  auVar34._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
  auVar34._0_8_ = uVar38;
  auVar34._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
  auVar33 = vshufpd_avx(auVar34,auVar34,1);
  uVar63 = auVar33._0_8_;
LAB_003d77e7:
  SVar79.values.values[2] = (float)(int)uVar63;
  SVar79.values.values[3] = (float)(int)((ulong)uVar63 >> 0x20);
  SVar79.values.values[0] = (float)(int)uVar38;
  SVar79.values.values[1] = (float)(int)((ulong)uVar38 >> 0x20);
  return (SampledSpectrum)SVar79.values.values;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface()) {
                    const SurfaceInteraction &si = pt.GetInteraction().AsSurface();
                    ctx = LightSampleContext(si);
                    // Try to nudge the light sampling position to correct side of the
                    // surface
                    if (pt.bsdf.HasReflection() && !pt.bsdf.HasTransmission())
                        ctx.pi = si.OffsetRayOrigin(si.wo);
                    else if (pt.bsdf.HasTransmission() && !pt.bsdf.HasReflection())
                        ctx.pi = si.OffsetRayOrigin(-si.wo);
                } else
                    ctx = LightSampleContext(pt.GetInteraction());
                pstd::optional<LightLiSample> lightWeight =
                    light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight && lightWeight->L && lightWeight->pdf > 0) {
                    EndpointInteraction ei(light, lightWeight->pLight);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight->L / (lightWeight->pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PDFLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight->wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight->pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}